

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O2

void cfd::TransactionContextUtil::AddSign<cfd::TransactionContext>
               (TransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  pointer pSVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  undefined4 uVar5;
  uint uVar6;
  CfdException *pCVar7;
  pointer pSVar8;
  byte bVar9;
  ScriptElement *element;
  ScriptBuilder builder;
  ScriptOperator op_code;
  Script local_108;
  Script script;
  Txid txid;
  ScriptWitness local_50;
  
  if (transaction == (TransactionContext *)0x0) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&op_code,"Empty transaction.",(allocator *)&script);
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&op_code);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    cVar2 = cfd::core::OutPoint::IsValid();
    if (cVar2 != '\0') {
      if (insert_witness) {
        bVar9 = 0;
      }
      else {
        pSVar1 = (sign_params->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar9 = 0;
        for (pSVar8 = (sign_params->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar1;
            pSVar8 = pSVar8 + 1) {
          bVar4 = SignParameter::IsOpCode(pSVar8);
          if (bVar4) {
            SignParameter::GetOpCode(&op_code,pSVar8);
            bVar3 = cfd::core::ScriptOperator::IsPushOperator();
            bVar9 = bVar9 | bVar3;
            core::ScriptOperator::~ScriptOperator(&op_code);
          }
        }
      }
      cfd::core::OutPoint::GetTxid();
      uVar5 = cfd::core::OutPoint::GetVout();
      uVar6 = (**(code **)(*(long *)transaction + 0x10))(transaction,&txid,uVar5);
      if (insert_witness) {
        if (clear_stack) {
          cfd::core::Transaction::RemoveScriptWitnessStackAll((uint)transaction);
        }
        pSVar1 = (sign_params->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar8 = (sign_params->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar1;
            pSVar8 = pSVar8 + 1) {
          SignParameter::ConvertToSignature((ByteData *)&op_code,pSVar8);
          cfd::core::Transaction::AddScriptWitnessStack((uint)&local_50,(ByteData *)transaction);
          core::ScriptWitness::~ScriptWitness(&local_50);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&op_code);
        }
      }
      else {
        cfd::core::Script::Script(&script);
        if (!clear_stack) {
          cfd::core::Transaction::GetTxIn((uint)&op_code);
          cfd::core::Script::Script((Script *)&builder,&local_108);
          cfd::core::Script::operator=(&script,(Script *)&builder);
          core::Script::~Script((Script *)&builder);
          core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&op_code);
        }
        builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_002cee38;
        builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cfd::core::Script::GetElementList();
        for (; op_code._vptr_ScriptOperator !=
               (_func_int **)CONCAT44(op_code._12_4_,op_code.data_type_);
            op_code._vptr_ScriptOperator = op_code._vptr_ScriptOperator + 0xc) {
          cfd::core::ScriptBuilder::AppendElement((ScriptElement *)&builder);
        }
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &op_code);
        pSVar1 = (sign_params->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar8 = (sign_params->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar1;
            pSVar8 = pSVar8 + 1) {
          if (((bVar9 & 1) == 0) || (bVar4 = SignParameter::IsOpCode(pSVar8), !bVar4)) {
            SignParameter::ConvertToSignature((ByteData *)&op_code,pSVar8);
            cfd::core::ScriptBuilder::AppendData((ByteData *)&builder);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&op_code);
          }
          else {
            SignParameter::GetOpCode(&op_code,pSVar8);
            cfd::core::ScriptBuilder::AppendOperator((ScriptOperator *)&builder);
            core::ScriptOperator::~ScriptOperator(&op_code);
          }
        }
        cfd::core::ScriptBuilder::Build();
        cfd::core::Transaction::SetUnlockingScript((uint)transaction,(Script *)(ulong)uVar6);
        core::Script::~Script((Script *)&op_code);
        core::ScriptBuilder::~ScriptBuilder(&builder);
        core::Script::~Script(&script);
      }
      core::Txid::~Txid(&txid);
      return;
    }
    op_code._vptr_ScriptOperator = (_func_int **)0x27e46f;
    op_code.data_type_ = 0x101;
    op_code.text_data_._M_dataplus._M_p = "AddSign";
    core::logger::warn<>((CfdSourceLocation *)&op_code,"Failed to AddSign. Invalid outpoint.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&op_code,"Invalid outpoint.",(allocator *)&script);
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&op_code);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  op_code._vptr_ScriptOperator = (_func_int **)0x27e46f;
  op_code.data_type_ = kOpSuccess252;
  op_code.text_data_._M_dataplus._M_p = "AddSign";
  core::logger::warn<>((CfdSourceLocation *)&op_code,"Failed to AddSign. Empty sign_params.");
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&op_code,"Empty sign_params.",(allocator *)&script);
  core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&op_code);
  __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}